

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KinDynComputations.cpp
# Opt level: O1

bool __thiscall
iDynTree::KinDynComputations::getAverageVelocityJacobian
          (KinDynComputations *this,MatrixView<double> *avgVelocityJacobian)

{
  long lVar1;
  Index row;
  long lVar2;
  PointerType pdVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  element_type *peVar7;
  pointer peVar8;
  pointer peVar9;
  element_type *peVar10;
  long lVar11;
  bool bVar12;
  bool bVar13;
  type tmp;
  Matrix6x6 invLockedInertia;
  element_type *local_220 [2];
  MatrixView<double> local_210;
  MatrixView<double> local_1e0;
  undefined1 *local_1b0 [2];
  PointerType local_1a0;
  variable_if_dynamic<long,__1> local_198;
  variable_if_dynamic<long,__1> local_190;
  PointerType local_188;
  variable_if_dynamic<long,__1> local_180;
  variable_if_dynamic<long,__1> local_178;
  variable_if_dynamic<long,__1> local_168;
  variable_if_dynamic<long,__1> vStack_160;
  long local_158;
  undefined1 local_150 [288];
  
  if (avgVelocityJacobian->m_rows == 6) {
    lVar6 = avgVelocityJacobian->m_cols;
    lVar2 = iDynTree::Model::getNrOfDOFs();
    bVar12 = lVar6 == lVar2 + 6;
  }
  else {
    bVar12 = false;
  }
  if (bVar12) {
    computeRawMassMatrixAndTotalMomentum(this);
    KinDynComputationsPrivateAttributes::getRobotLockedInertia(this->pimpl);
    iDynTree::SpatialInertia::getInverse();
    pdVar3 = (PointerType)iDynTree::MatrixDynSize::data();
    lVar4 = iDynTree::MatrixDynSize::rows();
    lVar5 = iDynTree::MatrixDynSize::cols();
    lVar6 = iDynTree::Model::getNrOfDOFs();
    local_190.m_value = lVar6 + 6;
    local_198.m_value = 6;
    local_168.m_value = 0;
    vStack_160.m_value = 0;
    bVar13 = avgVelocityJacobian->m_storageOrder == ColumnMajor;
    peVar9 = avgVelocityJacobian->m_storage;
    lVar6 = avgVelocityJacobian->m_rows;
    lVar2 = 1;
    if (bVar13) {
      lVar2 = lVar6;
    }
    lVar1 = avgVelocityJacobian->m_cols;
    lVar11 = lVar1;
    if (bVar13) {
      lVar11 = 1;
    }
    local_1b0[0] = local_150;
    local_1a0 = pdVar3;
    local_188 = pdVar3;
    local_180.m_value = lVar4;
    local_178.m_value = lVar5;
    local_158 = lVar5;
    Eigen::Matrix<double,6,-1,0,6,-1>::
    Matrix<Eigen::Product<Eigen::Map<Eigen::Matrix<double,6,6,1,6,6>,0,Eigen::Stride<0,0>>,Eigen::Block<Eigen::Map<Eigen::Matrix<double,_1,_1,1,_1,_1>,0,Eigen::Stride<0,0>>,_1,_1,false>,0>>
              ((Matrix<double,6,_1,0,6,_1> *)local_220,
               (Product<Eigen::Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,_0>
                *)local_1b0);
    if (0 < lVar6) {
      lVar4 = 0;
      peVar7 = local_220[0];
      do {
        peVar8 = peVar9;
        peVar10 = peVar7;
        lVar5 = lVar1;
        if (0 < lVar1) {
          do {
            *peVar8 = *peVar10;
            peVar10 = peVar10 + 6;
            peVar8 = peVar8 + lVar2;
            lVar5 = lVar5 + -1;
          } while (lVar5 != 0);
        }
        lVar4 = lVar4 + 1;
        peVar7 = peVar7 + 1;
        peVar9 = peVar9 + lVar11;
      } while (lVar4 != lVar6);
    }
    free(local_220[0]);
    local_1e0.m_storage = avgVelocityJacobian->m_storage;
    local_1e0.m_rows = avgVelocityJacobian->m_rows;
    local_1e0.m_cols = avgVelocityJacobian->m_cols;
    local_1e0.m_storageOrder = avgVelocityJacobian->m_storageOrder;
    local_1e0.m_innerStride = avgVelocityJacobian->m_innerStride;
    local_1e0.m_outerStride = avgVelocityJacobian->m_outerStride;
    KinDynComputationsPrivateAttributes::processOnRightSideMatrixExpectingBodyFixedModelVelocity
              (this->pimpl,&local_1e0);
    local_210.m_storage = avgVelocityJacobian->m_storage;
    local_210.m_rows = avgVelocityJacobian->m_rows;
    local_210.m_cols = avgVelocityJacobian->m_cols;
    local_210.m_storageOrder = avgVelocityJacobian->m_storageOrder;
    local_210.m_innerStride = avgVelocityJacobian->m_innerStride;
    local_210.m_outerStride = avgVelocityJacobian->m_outerStride;
    KinDynComputationsPrivateAttributes::processOnLeftSideBodyFixedAvgVelocityJacobian
              (this->pimpl,&local_210);
  }
  else {
    iDynTree::reportError
              ("KinDynComputations","getAverageVelocityJacobian",
               "Wrong size in input avgVelocityJacobian");
  }
  return bVar12;
}

Assistant:

bool KinDynComputations::getAverageVelocityJacobian(MatrixView<double> avgVelocityJacobian)
{
    bool ok = (avgVelocityJacobian.rows() == 6)
        && (avgVelocityJacobian.cols() == pimpl->m_robot_model.getNrOfDOFs() + 6);

    if( !ok )
    {
        reportError("KinDynComputations",
                    "getAverageVelocityJacobian",
                    "Wrong size in input avgVelocityJacobian");
        return false;
    }

    this->computeRawMassMatrixAndTotalMomentum();

    const SpatialInertia & lockedInertia = pimpl->getRobotLockedInertia();
    Matrix6x6 invLockedInertia = lockedInertia.getInverse();

    // The first six rows of the mass matrix are the base-base average velocity jacobian
    toEigen(avgVelocityJacobian) = toEigen(invLockedInertia)*toEigen(pimpl->m_rawMassMatrix).block(0,0,6,6+pimpl->m_robot_model.getNrOfDOFs());

    // Handle the different representations
    pimpl->processOnRightSideMatrixExpectingBodyFixedModelVelocity(avgVelocityJacobian);
    pimpl->processOnLeftSideBodyFixedAvgVelocityJacobian(avgVelocityJacobian);

    return true;
}